

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double pareto_variance(double a,double b)

{
  if (2.0 < b) {
    return (a * a * b) / ((b + -2.0) * (b + -1.0) * (b + -1.0));
  }
  std::operator<<((ostream *)&std::cout," \n");
  std::operator<<((ostream *)&std::cout,"PARETO_VARIANCE - Warning!\n");
  std::operator<<((ostream *)&std::cout,"  For B <= 2, the variance does not exist.\n");
  return 0.0;
}

Assistant:

double pareto_variance ( double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    PARETO_VARIANCE returns the variance of the Pareto PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < A,
//    0.0 < B.
//
//    Output, double PARETO_VARIANCE, the variance of the PDF.
//
{
  double variance;

  if ( b <= 2.0 )
  {
    cout << " \n";
    cout << "PARETO_VARIANCE - Warning!\n";
    cout << "  For B <= 2, the variance does not exist.\n";
    variance = 0.0;
    return variance;
  }

  variance = a * a * b / ( pow ( ( b - 1.0 ), 2 ) * ( b - 2.0 ) );

  return variance;
}